

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddKeyPubKeyInner
          (LegacyScriptPubKeyMan *this,CKey *key,CPubKey *pubkey)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)> *this_00;
  anon_class_24_3_aae1d6b4 *__f;
  CPubKey *in_RDX;
  CKey *in_RDI;
  long in_FS_OFFSET;
  CKeyingMaterial vchSecret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchCryptedSecret;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)>
  *in_stack_fffffffffffffef8;
  CKey *in_stack_ffffffffffffff08;
  array<unsigned_char,_32UL> *this_01;
  undefined8 in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined7 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  bool local_89;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret_00;
  LegacyScriptPubKeyMan *this_02;
  undefined1 local_70 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  signal_base local_8;
  
  local_8._vptr_signal_base = *(_func_int ***)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffef8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDI,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
  bVar1 = (**(code **)(*(long *)((in_RDI->keydata)._M_t.
                                 super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                                _M_head_impl)->_M_elems + 0x48))();
  if ((bVar1 & 1) == 0) {
    local_89 = FillableSigningProvider::AddKeyPubKey
                         ((FillableSigningProvider *)CONCAT17(bVar1,in_stack_ffffffffffffff40),
                          in_RDI,(CPubKey *)
                                 CONCAT17(in_stack_ffffffffffffff37,
                                          CONCAT16(in_stack_ffffffffffffff36,
                                                   in_stack_ffffffffffffff30)));
  }
  else {
    bVar2 = (**(code **)(*(long *)((in_RDI->keydata)._M_t.
                                   super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                                   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>.
                                  _M_head_impl)->_M_elems + 0x50))();
    if ((bVar2 & 1) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef8)
      ;
      CKey::begin((CKey *)in_stack_fffffffffffffef8);
      UCharCast((byte *)in_stack_fffffffffffffef8);
      this_00 = (function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)>
                 *)CKey::end(in_stack_ffffffffffffff08);
      __f = (anon_class_24_3_aae1d6b4 *)UCharCast((byte *)in_stack_fffffffffffffef8);
      std::vector<unsigned_char,secure_allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 CONCAT17(bVar1,in_stack_ffffffffffffff40),
                 (uchar *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 &in_RDI->fCompressed,
                 (allocator_type *)
                 CONCAT17(in_stack_ffffffffffffff37,CONCAT16(bVar2,in_stack_ffffffffffffff30)));
      this_01 = (in_RDI->keydata)._M_t.
                super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
      vchCryptedSecret_00 = &local_48;
      this_02 = (LegacyScriptPubKeyMan *)&stack0xffffffffffffffd0;
      std::function<bool(std::vector<unsigned_char,secure_allocator<unsigned_char>>const&)>::
      function<wallet::LegacyScriptPubKeyMan::AddKeyPubKeyInner(CKey_const&,CPubKey_const&)::__0,void>
                (this_00,__f);
      bVar1 = (**(code **)(*(long *)&(((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                                        *)this_01->_M_elems)->_M_impl).super__Vector_impl_data +
                          0x40))(this_01,local_70);
      std::function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)>::
      ~function(in_stack_fffffffffffffef8);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        bVar3 = AddCryptedKey(this_02,in_RDX,vchCryptedSecret_00);
        if (bVar3) {
          local_89 = true;
        }
        else {
          local_89 = false;
        }
      }
      else {
        local_89 = false;
      }
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)this_01);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
    }
    else {
      local_89 = false;
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffef8);
  if (*(_func_int ***)(in_FS_OFFSET + 0x28) == local_8._vptr_signal_base) {
    return local_89;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddKeyPubKeyInner(const CKey& key, const CPubKey &pubkey)
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::AddKeyPubKey(key, pubkey);
    }

    if (m_storage.IsLocked()) {
        return false;
    }

    std::vector<unsigned char> vchCryptedSecret;
    CKeyingMaterial vchSecret{UCharCast(key.begin()), UCharCast(key.end())};
    if (!m_storage.WithEncryptionKey([&](const CKeyingMaterial& encryption_key) {
            return EncryptSecret(encryption_key, vchSecret, pubkey.GetHash(), vchCryptedSecret);
        })) {
        return false;
    }

    if (!AddCryptedKey(pubkey, vchCryptedSecret)) {
        return false;
    }
    return true;
}